

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

string * __thiscall LTFlightData::FDStaticData::flightRoute_abi_cxx11_(FDStaticData *this)

{
  ulong uVar1;
  long in_RSI;
  string *in_RDI;
  string r;
  string *__lhs;
  string local_68 [8];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_30 [8];
  FDStaticData *in_stack_ffffffffffffffd8;
  
  __lhs = in_RDI;
  route_abi_cxx11_(in_stack_ffffffffffffffd8);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        std::operator+(__lhs,in_RDI);
        std::__cxx11::string::~string(local_68);
      }
      else {
        std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x110));
      }
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,local_30);
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string LTFlightData::FDStaticData::flightRoute() const
{
    const std::string r(route());
    // keep it an empty string if there is no info at all
    if (flight.empty() && r.empty())
        return std::string();
    
    // if there is some info missing then just return the other
    if (flight.empty())
        return r;
    if (r.empty())
        return flight;
    
    // we have both...put it together
    return (flight + ": ") + r;
}